

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.c++
# Opt level: O3

void __thiscall kj::GzipInputStream::GzipInputStream(GzipInputStream *this,InputStream *inner)

{
  Fault f;
  DebugComparison<int,_int> _kjCondition;
  Fault local_38;
  DebugComparison<int,_int> local_30;
  
  (this->super_InputStream)._vptr_InputStream = (_func_int **)&PTR__GzipInputStream_00628bc0;
  this->inner = inner;
  (this->ctx).next_in = (Bytef *)0x0;
  (this->ctx).avail_in = 0;
  (this->ctx).total_in = 0;
  (this->ctx).next_out = (Bytef *)0x0;
  (this->ctx).avail_out = 0;
  (this->ctx).total_out = 0;
  (this->ctx).msg = (char *)0x0;
  (this->ctx).state = (internal_state *)0x0;
  (this->ctx).zalloc = (alloc_func)0x0;
  (this->ctx).zfree = (free_func)0x0;
  (this->ctx).opaque = (voidpf)0x0;
  (this->ctx).data_type = 0;
  (this->ctx).adler = 0;
  (this->ctx).reserved = 0;
  this->atValidEndpoint = false;
  local_30.left = inflateInit2_(&this->ctx,0x1f,"1.2.11",0x70);
  local_30.right = 0;
  local_30.op.content.ptr = " == ";
  local_30.op.content.size_ = 5;
  local_30.result = local_30.left == 0;
  if (local_30.result) {
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&>
            (&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/gzip.c++"
             ,0x5a,FAILED,"inflateInit2(&ctx, 15 + 16) == Z_OK","_kjCondition,",&local_30);
  kj::_::Debug::Fault::fatal(&local_38);
}

Assistant:

GzipInputStream::GzipInputStream(InputStream& inner)
    : inner(inner) {
  // windowBits = 15 (maximum) + magic value 16 to ask for gzip.
  KJ_ASSERT(inflateInit2(&ctx, 15 + 16) == Z_OK);
}